

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

uint64_t vfp_expand_imm_aarch64(int size,uint8_t imm8)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  ulong local_18;
  uint64_t imm;
  uint8_t imm8_local;
  int size_local;
  
  if (size == 1) {
    uVar1 = extract32((uint)imm8,7,1);
    uVar2 = 0;
    if (uVar1 != 0) {
      uVar2 = 0x8000;
    }
    uVar1 = extract32((uint)imm8,6,1);
    uVar3 = 0x4000;
    if (uVar1 != 0) {
      uVar3 = 0x3000;
    }
    uVar1 = extract32((uint)imm8,0,6);
    local_18 = (ulong)(uVar2 | uVar3 | uVar1 << 6);
  }
  else if (size == 2) {
    uVar1 = extract32((uint)imm8,7,1);
    uVar2 = 0;
    if (uVar1 != 0) {
      uVar2 = 0x8000;
    }
    uVar1 = extract32((uint)imm8,6,1);
    uVar3 = 0x4000;
    if (uVar1 != 0) {
      uVar3 = 0x3e00;
    }
    uVar1 = extract32((uint)imm8,0,6);
    local_18 = (ulong)(uVar2 | uVar3 | uVar1 << 3) << 0x10;
  }
  else {
    if (size != 3) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-vfp.inc.c"
                 ,0x3e,(char *)0x0);
    }
    uVar1 = extract32((uint)imm8,7,1);
    uVar2 = 0;
    if (uVar1 != 0) {
      uVar2 = 0x8000;
    }
    uVar1 = extract32((uint)imm8,6,1);
    uVar3 = 0x4000;
    if (uVar1 != 0) {
      uVar3 = 0x3fc0;
    }
    uVar1 = extract32((uint)imm8,0,6);
    local_18 = (ulong)(uVar2 | uVar3 | uVar1) << 0x30;
  }
  return local_18;
}

Assistant:

uint64_t vfp_expand_imm(int size, uint8_t imm8)
{
    uint64_t imm = 0;

    switch (size) {
    case MO_64:
        imm = (extract32(imm8, 7, 1) ? 0x8000 : 0) |
            (extract32(imm8, 6, 1) ? 0x3fc0 : 0x4000) |
            extract32(imm8, 0, 6);
        imm <<= 48;
        break;
    case MO_32:
        imm = (extract32(imm8, 7, 1) ? 0x8000 : 0) |
            (extract32(imm8, 6, 1) ? 0x3e00 : 0x4000) |
            (extract32(imm8, 0, 6) << 3);
        imm <<= 16;
        break;
    case MO_16:
        imm = (extract32(imm8, 7, 1) ? 0x8000 : 0) |
            (extract32(imm8, 6, 1) ? 0x3000 : 0x4000) |
            (extract32(imm8, 0, 6) << 6);
        break;
    default:
        g_assert_not_reached();
    }
    return imm;
}